

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

string * testing::internal::
         DefaultParamName<std::tuple<std::tuple<void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),void(*)(unsigned_char*,long,unsigned_char,unsigned_char_const*,unsigned_char_const*,int),int>,unsigned_char>>
                   (TestParamInfo<std::tuple<std::tuple<void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_void_(*)(unsigned_char_*,_long,_unsigned_char,_const_unsigned_char_*,_const_unsigned_char_*,_int),_int>,_unsigned_char>_>
                    *info)

{
  Message *in_RSI;
  string *in_RDI;
  Message name_stream;
  unsigned_long *in_stack_ffffffffffffffb8;
  string *this;
  
  this = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<((Message *)in_RDI,in_stack_ffffffffffffffb8);
  Message::GetString_abi_cxx11_((Message *)this);
  Message::~Message((Message *)0x69efaa);
  return this;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}